

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::ScaleRatioFromValueT<float,float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 in_register_00001204 [60];
  undefined1 auVar17 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 in_register_00001284 [60];
  undefined1 in_register_000012c4 [12];
  float fVar21;
  float fVar22;
  int iVar23;
  float fVar24;
  undefined1 auVar20 [64];
  
  auVar20._4_60_ = in_register_00001284;
  auVar20._0_4_ = v_max;
  auVar19 = auVar20._0_16_;
  auVar18._4_60_ = in_register_00001244;
  auVar18._0_4_ = v_min;
  auVar15 = auVar18._0_16_;
  auVar17._4_60_ = in_register_00001204;
  auVar17._0_4_ = v;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return 0.0;
  }
  auVar14 = vminss_avx(auVar15,auVar19);
  auVar11 = vmaxss_avx(auVar19,auVar15);
  auVar11 = vminss_avx(auVar11,auVar17._0_16_);
  uVar2 = vcmpss_avx512f(auVar17._0_16_,auVar14,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar11._0_4_ = (float)((uint)bVar3 * auVar14._0_4_ + (uint)!bVar3 * auVar11._0_4_);
  if (!is_logarithmic) {
    return (auVar11._0_4_ - v_min) / (v_max - v_min);
  }
  auVar1 = vminss_avx(auVar19,auVar15);
  auVar14 = vmaxss_avx(auVar15,auVar19);
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx512vl(auVar14,auVar12);
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar7._4_12_ = in_register_000012c4;
  auVar7._0_4_ = logarithmic_zero_epsilon;
  auVar13 = vxorps_avx512vl(auVar7,auVar5);
  uVar2 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x20,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  iVar23 = auVar13._0_4_;
  auVar8._4_12_ = in_register_000012c4;
  auVar8._0_4_ = logarithmic_zero_epsilon;
  uVar2 = vcmpss_avx512f(auVar12,auVar8,1);
  bVar4 = (bool)((byte)uVar2 & 1);
  fVar16 = auVar14._0_4_;
  fVar10 = (float)((uint)bVar4 *
                   ((uint)bVar3 * iVar23 + (uint)!bVar3 * (int)logarithmic_zero_epsilon) +
                  (uint)!bVar4 * (int)fVar16);
  fVar21 = auVar1._0_4_;
  if ((fVar21 != 0.0) || (0.0 <= fVar16)) {
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar12 = vandps_avx512vl(auVar1,auVar6);
    bVar4 = fVar21 < 0.0;
    auVar9._4_12_ = in_register_000012c4;
    auVar9._0_4_ = logarithmic_zero_epsilon;
    uVar2 = vcmpss_avx512f(auVar12,auVar9,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar13._4_12_ = auVar1._4_12_;
    auVar13._0_4_ =
         (uint)bVar3 * ((uint)bVar4 * iVar23 + (uint)!bVar4 * (int)logarithmic_zero_epsilon) +
         (uint)!bVar3 * (int)fVar21;
    uVar2 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x20,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar10 = (float)((uint)bVar3 * ((uint)bVar4 * iVar23 + (uint)!bVar4 * (int)fVar10) +
                    (uint)!bVar3 * (int)fVar10);
  }
  fVar22 = 0.0;
  fVar24 = auVar13._0_4_;
  if (fVar24 < auVar11._0_4_) {
    if (fVar10 <= auVar11._0_4_) {
      fVar22 = 1.0;
    }
    else {
      if (0.0 <= v_min * v_max) {
        if ((fVar21 < 0.0) || (fVar16 < 0.0)) {
          fVar16 = logf(auVar11._0_4_ / fVar10);
          fVar10 = logf(fVar24 / fVar10);
          fVar22 = 1.0 - fVar16 / fVar10;
        }
        else {
          fVar22 = logf(auVar11._0_4_ / fVar24);
          fVar10 = logf(fVar10 / fVar24);
          fVar22 = fVar22 / fVar10;
        }
      }
      else {
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar14 = vxorps_avx512vl(auVar1,auVar14);
        fVar22 = auVar14._0_4_ / (fVar16 - fVar21);
        if ((v == 0.0) && (!NAN(v))) goto LAB_00306012;
        if (0.0 <= v) {
          fVar16 = logf(auVar11._0_4_ / logarithmic_zero_epsilon);
          fVar10 = logf(fVar10 / logarithmic_zero_epsilon);
          auVar15 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (fVar22 + zero_deadzone_halfsize))),
                                    ZEXT416((uint)(fVar16 / fVar10)),
                                    ZEXT416((uint)(fVar22 + zero_deadzone_halfsize)));
          fVar22 = auVar15._0_4_;
        }
        else {
          auVar15._8_4_ = 0x80000000;
          auVar15._0_8_ = 0x8000000080000000;
          auVar15._12_4_ = 0x80000000;
          auVar15 = vxorps_avx512vl(auVar11,auVar15);
          fVar10 = logf(auVar15._0_4_ / logarithmic_zero_epsilon);
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar15 = vxorps_avx512vl(auVar13,auVar19);
          fVar16 = logf(auVar15._0_4_ / logarithmic_zero_epsilon);
          fVar22 = (1.0 - fVar10 / fVar16) * (fVar22 - zero_deadzone_halfsize);
        }
      }
      auVar19 = ZEXT416((uint)v_max);
      auVar15 = ZEXT416((uint)v_min);
    }
  }
LAB_00306012:
  uVar2 = vcmpss_avx512f(auVar19,auVar15,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  return (float)((uint)bVar3 * (int)(1.0 - fVar22) + (uint)!bVar3 * (int)fVar22);
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}